

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_deserialize_container
          (t_cpp_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  bool use_push;
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  string *prefix_00;
  string i;
  string size;
  string etype;
  string vtype;
  string ktype;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  std::__cxx11::string::string((string *)&local_b0,"_size",(allocator *)&local_170);
  t_generator::tmp(&local_1f0,(t_generator *)this,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_d0,"_ktype",(allocator *)&local_190);
  t_generator::tmp(&local_170,(t_generator *)this,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string((string *)&local_f0,"_vtype",(allocator *)&local_1b0);
  t_generator::tmp(&local_190,(t_generator *)this,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::string((string *)&local_110,"_etype",(allocator *)&local_230);
  t_generator::tmp(&local_1b0,(t_generator *)this,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  use_push = (bool)ttype[1].super_t_doc.doc_.field_2._M_local_buf[8];
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,(string *)prefix);
  poVar2 = std::operator<<(poVar2,".clear();");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_230,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_230);
  poVar2 = std::operator<<(poVar2,"uint32_t ");
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,";");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_230);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar1 != '\0') {
      t_generator::indent_abi_cxx11_(&local_230,(t_generator *)this);
      poVar2 = std::operator<<(out,(string *)&local_230);
      poVar2 = std::operator<<(poVar2,"::apache::thrift::protocol::TType ");
      poVar2 = std::operator<<(poVar2,(string *)&local_1b0);
      poVar2 = std::operator<<(poVar2,";");
      poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_210,(t_generator *)this);
      poVar2 = std::operator<<(poVar2,(string *)&local_210);
      poVar2 = std::operator<<(poVar2,"xfer += iprot->readSetBegin(");
      poVar2 = std::operator<<(poVar2,(string *)&local_1b0);
      poVar2 = std::operator<<(poVar2,", ");
      poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
      poVar2 = std::operator<<(poVar2,");");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      goto LAB_00188a39;
    }
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar1 != '\0') {
      t_generator::indent_abi_cxx11_(&local_230,(t_generator *)this);
      poVar2 = std::operator<<(out,(string *)&local_230);
      poVar2 = std::operator<<(poVar2,"::apache::thrift::protocol::TType ");
      poVar2 = std::operator<<(poVar2,(string *)&local_1b0);
      poVar2 = std::operator<<(poVar2,";");
      poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_210,(t_generator *)this);
      poVar2 = std::operator<<(poVar2,(string *)&local_210);
      poVar2 = std::operator<<(poVar2,"xfer += iprot->readListBegin(");
      poVar2 = std::operator<<(poVar2,(string *)&local_1b0);
      poVar2 = std::operator<<(poVar2,", ");
      poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
      poVar2 = std::operator<<(poVar2,");");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_230);
      if (use_push == false) {
        poVar2 = t_generator::indent((t_generator *)this,out);
        poVar2 = std::operator<<(poVar2,(string *)prefix);
        poVar2 = std::operator<<(poVar2,".resize(");
        poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
        poVar2 = std::operator<<(poVar2,");");
        std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      }
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_230,(t_generator *)this);
    poVar2 = std::operator<<(out,(string *)&local_230);
    poVar2 = std::operator<<(poVar2,"::apache::thrift::protocol::TType ");
    poVar2 = std::operator<<(poVar2,(string *)&local_170);
    poVar2 = std::operator<<(poVar2,";");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_210,(t_generator *)this);
    poVar2 = std::operator<<(poVar2,(string *)&local_210);
    poVar2 = std::operator<<(poVar2,"::apache::thrift::protocol::TType ");
    poVar2 = std::operator<<(poVar2,(string *)&local_190);
    poVar2 = std::operator<<(poVar2,";");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_1d0,(t_generator *)this);
    poVar2 = std::operator<<(poVar2,(string *)&local_1d0);
    poVar2 = std::operator<<(poVar2,"xfer += iprot->readMapBegin(");
    poVar2 = std::operator<<(poVar2,(string *)&local_170);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = std::operator<<(poVar2,(string *)&local_190);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
    poVar2 = std::operator<<(poVar2,");");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1d0);
LAB_00188a39:
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
  }
  std::__cxx11::string::string((string *)&local_130,"_i",(allocator *)&local_210);
  t_generator::tmp(&local_230,(t_generator *)this,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  t_generator::indent_abi_cxx11_(&local_210,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&local_210);
  poVar2 = std::operator<<(poVar2,"uint32_t ");
  poVar2 = std::operator<<(poVar2,(string *)&local_230);
  poVar2 = std::operator<<(poVar2,";");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1d0,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d0);
  poVar2 = std::operator<<(poVar2,"for (");
  poVar2 = std::operator<<(poVar2,(string *)&local_230);
  poVar2 = std::operator<<(poVar2," = 0; ");
  poVar2 = std::operator<<(poVar2,(string *)&local_230);
  poVar2 = std::operator<<(poVar2," < ");
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"; ++");
  poVar2 = std::operator<<(poVar2,(string *)&local_230);
  poVar2 = std::operator<<(poVar2,")");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_210);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar1 != '\0') {
      prefix_00 = &local_70;
      std::__cxx11::string::string((string *)prefix_00,(string *)prefix);
      generate_deserialize_set_element(this,out,(t_set *)ttype,prefix_00);
      goto LAB_00188dca;
    }
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar1 != '\0') {
      std::__cxx11::string::string((string *)&local_90,(string *)prefix);
      std::__cxx11::string::string((string *)&local_150,(string *)&local_230);
      prefix_00 = &local_90;
      generate_deserialize_list_element(this,out,(t_list *)ttype,prefix_00,use_push,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      goto LAB_00188dca;
    }
  }
  else {
    prefix_00 = &local_50;
    std::__cxx11::string::string((string *)prefix_00,(string *)prefix);
    generate_deserialize_map_element(this,out,(t_map *)ttype,prefix_00);
LAB_00188dca:
    std::__cxx11::string::~string((string *)prefix_00);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar1 == '\0') goto LAB_00188e58;
      poVar2 = t_generator::indent((t_generator *)this,out);
      pcVar3 = "xfer += iprot->readListEnd();";
    }
    else {
      poVar2 = t_generator::indent((t_generator *)this,out);
      pcVar3 = "xfer += iprot->readSetEnd();";
    }
  }
  else {
    poVar2 = t_generator::indent((t_generator *)this,out);
    pcVar3 = "xfer += iprot->readMapEnd();";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
LAB_00188e58:
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_1f0);
  return;
}

Assistant:

void t_cpp_generator::generate_deserialize_container(ostream& out, t_type* ttype, string prefix) {
  scope_up(out);

  string size = tmp("_size");
  string ktype = tmp("_ktype");
  string vtype = tmp("_vtype");
  string etype = tmp("_etype");

  t_container* tcontainer = (t_container*)ttype;
  bool use_push = tcontainer->has_cpp_name();

  indent(out) << prefix << ".clear();" << endl << indent() << "uint32_t " << size << ";" << endl;

  // Declare variables, read header
  if (ttype->is_map()) {
    out << indent() << "::apache::thrift::protocol::TType " << ktype << ";" << endl << indent()
        << "::apache::thrift::protocol::TType " << vtype << ";" << endl << indent()
        << "xfer += iprot->readMapBegin(" << ktype << ", " << vtype << ", " << size << ");" << endl;
  } else if (ttype->is_set()) {
    out << indent() << "::apache::thrift::protocol::TType " << etype << ";" << endl << indent()
        << "xfer += iprot->readSetBegin(" << etype << ", " << size << ");" << endl;
  } else if (ttype->is_list()) {
    out << indent() << "::apache::thrift::protocol::TType " << etype << ";" << endl << indent()
        << "xfer += iprot->readListBegin(" << etype << ", " << size << ");" << endl;
    if (!use_push) {
      indent(out) << prefix << ".resize(" << size << ");" << endl;
    }
  }

  // For loop iterates over elements
  string i = tmp("_i");
  out << indent() << "uint32_t " << i << ";" << endl << indent() << "for (" << i << " = 0; " << i
      << " < " << size << "; ++" << i << ")" << endl;

  scope_up(out);

  if (ttype->is_map()) {
    generate_deserialize_map_element(out, (t_map*)ttype, prefix);
  } else if (ttype->is_set()) {
    generate_deserialize_set_element(out, (t_set*)ttype, prefix);
  } else if (ttype->is_list()) {
    generate_deserialize_list_element(out, (t_list*)ttype, prefix, use_push, i);
  }

  scope_down(out);

  // Read container end
  if (ttype->is_map()) {
    indent(out) << "xfer += iprot->readMapEnd();" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "xfer += iprot->readSetEnd();" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "xfer += iprot->readListEnd();" << endl;
  }

  scope_down(out);
}